

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O3

_Bool effect_handler_MOVE_ATTACK(effect_handler_context_t *context)

{
  _Bool _Var1;
  wchar_t wVar2;
  monster *pmVar3;
  loc_conflict lVar4;
  loc grid;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  _Bool fear;
  loc target;
  _Bool local_49;
  loc local_48;
  wchar_t local_40;
  uint local_3c;
  ulong local_38;
  
  wVar2 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  local_48.x = (player->grid).x;
  local_48.y = (player->grid).y;
  if ((long)context->dir == 5) {
    target_get((loc_conflict *)&local_48);
  }
  else {
    local_48 = (loc)loc_sum((loc_conflict)local_48,(loc_conflict)ddgrid[context->dir]);
  }
  pmVar3 = square_monster(cave,local_48);
  if ((pmVar3 != (monster *)0x0) && (_Var1 = monster_is_obvious(pmVar3), _Var1)) {
    uVar10 = 4;
    uVar7 = 4;
    local_40 = wVar2;
    while( true ) {
      wVar2 = distance(player->grid,(loc_conflict)local_48);
      if ((wVar2 < L'\x02') || (uVar7 == 0)) break;
      lVar4 = loc_diff((loc_conflict)local_48,player->grid);
      if (lVar4.x == 0) {
        uVar8 = (uint)(-1 < (long)lVar4) << 2;
      }
      else if ((ulong)lVar4 >> 0x20 == 0) {
        uVar8 = ((uint)((ulong)lVar4 >> 0x1f) & 1) * 4 + 2;
      }
      else if (lVar4.x < 0) {
        uVar8 = (lVar4.y >> 0x1f) * -2 + 5;
      }
      else {
        uVar8 = (uint)(-1 < (long)lVar4) * 2 + 1;
      }
      lVar11 = 0;
      local_3c = uVar7 - 1;
      local_38 = uVar10;
      while( true ) {
        uVar5 = (uVar8 | 8) + *(int *)((long)&DAT_0025e468 + lVar11);
        uVar7 = (uVar8 | 8) + 7 + *(int *)((long)&DAT_0025e468 + lVar11);
        if (-1 < (int)uVar5) {
          uVar7 = uVar5;
        }
        iVar6 = uVar5 - (uVar7 & 0xfffffff8);
        grid = (loc)loc_sum(player->grid,(loc_conflict)clockwise_grid[iVar6]);
        _Var1 = square_ispassable(cave,grid);
        if (_Var1) break;
        lVar11 = lVar11 + 4;
        if (lVar11 == 0xc) {
          msg("The way is barred.");
          return (int)local_38 != 4;
        }
      }
      pmVar3 = square_monster(cave,grid);
      move_player((int)clockwise_ddd[iVar6],false);
      uVar10 = (ulong)local_3c;
      uVar7 = local_3c;
      if (pmVar3 != (monster *)0x0) {
        return false;
      }
    }
    iVar9 = (int)uVar10 * local_40;
    iVar6 = iVar9 + 2;
    iVar9 = iVar9 + 5;
    if (-1 < iVar6) {
      iVar9 = iVar6;
    }
    iVar6 = (iVar9 >> 2) + 1;
    do {
      if (iVar6 + -1 == 0 || iVar6 < 1) {
        return true;
      }
      _Var1 = py_attack_real(player,local_48,&local_49);
      iVar6 = iVar6 + -1;
    } while (!_Var1);
    return true;
  }
  msg("This spell must target a monster.");
  return false;
}

Assistant:

bool effect_handler_MOVE_ATTACK(effect_handler_context_t *context)
{
	int blows = effect_calculate_value(context, false);
	int moves = 4;
	int d, i;
	struct loc target = player->grid;
	struct loc next_grid, grid_diff;
	bool fear;
	struct monster *mon;

	/* Ask for a target */
	if (context->dir == DIR_TARGET) {
		target_get(&target);
	} else {
		target = loc_sum(player->grid, ddgrid[context->dir]);
	}

	mon = square_monster(cave, target);
	if (mon == NULL || !monster_is_obvious(mon)) {
		msg("This spell must target a monster.");
		return false;
	}

	while (distance(player->grid, target) > 1 && moves > 0) {
		int choice[] = { 0, 1, -1 };
		bool attack = false;
		grid_diff = loc_diff(target, player->grid);

		/* Choice of direction simplified by prioritizing diagonals */
		if (grid_diff.x == 0) {
			d = (grid_diff.y < 0) ? 0 : 4; /* up : down */
		} else if (grid_diff.y == 0) {
			d = (grid_diff.x < 0) ? 6 : 2; /* left : right */
		} else if (grid_diff.x < 0) {
			d = (grid_diff.y < 0) ? 7 : 5; /* up-left : down-left */
		} else {/* grid_diff.x > 0 */
			d = (grid_diff.y < 0) ? 1 : 3; /* up-right : down-right */
		}

		/* We'll give up to 3 choices: d, d + 1, d - 1 */
		for (i = 0; i < 3; i++) {
			int d_test = (d + choice[i] + 8) % 8;
			next_grid = loc_sum(player->grid, clockwise_grid[d_test]);
			if (square_ispassable(cave, next_grid)) {
				d = d_test;
				if (square_monster(cave, next_grid)) attack = true;
				break;
			} else if (i == 2) {
				msg("The way is barred.");
				return moves != 4;
			}
		}

		move_player(clockwise_ddd[d], false);
		moves--;
		if (attack) return false;
	}

	/* Reduce blows based on distance traveled, round to nearest blow */
	blows = (blows * moves + 2) / 4;

	/* Should return some energy if monster dies early */
	while (blows-- > 0) {
		if (py_attack_real(player, target, &fear)) break;
	}

	return true;
}